

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O2

int Amap_ParseCountPins(Vec_Ptr_t *vTokens,int iPos)

{
  int iVar1;
  char *__s1;
  int iVar2;
  
  iVar2 = 0;
  do {
    if (vTokens->nSize <= iPos) {
      return iVar2;
    }
    __s1 = (char *)Vec_PtrEntry(vTokens,iPos);
    iVar1 = strcmp(__s1,"PIN");
    if (iVar1 == 0) {
      iVar2 = iVar2 + 1;
    }
    else {
      iVar1 = strcmp(__s1,"GATE");
      if (iVar1 == 0) {
        return iVar2;
      }
    }
    iPos = iPos + 1;
  } while( true );
}

Assistant:

int Amap_ParseCountPins( Vec_Ptr_t * vTokens, int iPos )
{
    char * pToken;
    int i, Counter = 0;
    Vec_PtrForEachEntryStart( char *, vTokens, pToken, i, iPos )
        if ( !strcmp( pToken, AMAP_STRING_PIN ) )
            Counter++;
        else if ( !strcmp( pToken, AMAP_STRING_GATE ) )
            return Counter;
    return Counter;
}